

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void telnet_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,int error_code)

{
  Telnet *telnet;
  int error_code_local;
  char *error_msg_local;
  int port_local;
  SockAddr *addr_local;
  PlugLogType type_local;
  Plug *plug_local;
  
  backend_socket_log((Seat *)plug[-0x11].vt,(LogContext *)plug[-0x10].vt,type,addr,port,error_msg,
                     error_code,(Conf *)plug[-2].vt,(_Bool)(*(byte *)&plug[-0x12].vt & 1));
  if ((type == PLUGLOG_CONNECT_SUCCESS) &&
     (*(undefined1 *)&plug[-0x12].vt = 1, plug[-0xf].vt != (PlugVtable *)0x0)) {
    ldisc_check_sendok((Ldisc *)plug[-0xf].vt);
  }
  return;
}

Assistant:

static void telnet_log(Plug *plug, PlugLogType type, SockAddr *addr, int port,
                       const char *error_msg, int error_code)
{
    Telnet *telnet = container_of(plug, Telnet, plug);
    backend_socket_log(telnet->seat, telnet->logctx, type, addr, port,
                       error_msg, error_code, telnet->conf,
                       telnet->socket_connected);
    if (type == PLUGLOG_CONNECT_SUCCESS) {
        telnet->socket_connected = true;
        if (telnet->ldisc)
            ldisc_check_sendok(telnet->ldisc);
    }
}